

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_parse_w(archive_acl *acl,wchar_t *text,wchar_t default_type)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  uint uVar3;
  int iVar4;
  wchar_t wVar5;
  ulong uVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  int *piVar10;
  wchar_t id;
  wchar_t wVar11;
  wchar_t *pwVar12;
  ulong uVar13;
  wchar_t permset;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t local_94;
  ulong local_90;
  wchar_t local_84;
  wchar_t *local_80;
  wchar_t *local_78 [8];
  archive_acl *local_38;
  
  wVar5 = L'\0';
  if ((text != (wchar_t *)0x0) && (*text != L'\0')) {
    local_38 = acl;
    local_84 = default_type;
    uVar6 = 0;
    do {
      do {
        while ((uVar13 = uVar6, uVar6 = (ulong)(uint)*text, pwVar8 = text, uVar6 < 0x21 &&
               ((0x100000600U >> (uVar6 & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar6 = uVar13;
        }
        while ((uVar3 = (uint)uVar6, 0x3a < uVar3 ||
               (pwVar2 = pwVar8, (0x400100000000401U >> (uVar6 & 0x3f) & 1) == 0))) {
          uVar6 = (ulong)(uint)pwVar8[1];
          pwVar8 = pwVar8 + 1;
        }
        do {
          pwVar12 = pwVar2;
          if (0x20 < (ulong)(uint)pwVar12[-1]) break;
          pwVar2 = pwVar12 + -1;
        } while ((0x100000600U >> ((ulong)(uint)pwVar12[-1] & 0x3f) & 1) != 0);
        if (uVar13 < 4) {
          local_78[uVar13 * 2] = text;
          local_78[uVar13 * 2 + 1] = pwVar12;
        }
        text = pwVar8 + (uVar3 != 0);
        uVar6 = uVar13 + 1;
      } while (uVar3 == 0x3a);
      if (uVar13 < 3) {
        memset(local_78 + uVar13 * 2 + 2,0,uVar13 * -0x10 + 0x30);
      }
      pwVar12 = local_78[3];
      pwVar2 = local_78[1];
      pwVar8 = local_78[0];
      if (local_78[2] < local_78[3]) {
        id = L'\0';
        pwVar7 = local_78[2];
        do {
          wVar5 = *pwVar7;
          if ((uint)(wVar5 + L'\xffffffc6') < 0xfffffff6) goto LAB_0048f5d1;
          wVar11 = L'\x7fffffff';
          if ((id < L'\x0ccccccd') && ((id != L'\x0ccccccc' || ((uint)wVar5 < 0x38)))) {
            wVar11 = wVar5 + id * 10 + L'\xffffffd0';
          }
          id = wVar11;
          pwVar7 = pwVar7 + 1;
        } while (pwVar7 < local_78[3]);
      }
      else {
LAB_0048f5d1:
        id = L'\xffffffff';
      }
      if (2 < uVar13 && id == L'\xffffffff') {
        if (local_78[6] < local_78[7]) {
          pwVar7 = local_78[6];
          wVar5 = L'\0';
          do {
            uVar3 = *pwVar7;
            if (uVar3 - 0x3a < 0xfffffff6) goto LAB_0048f633;
            id = L'\x7fffffff';
            if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (uVar3 < 0x38)))) {
              id = uVar3 + wVar5 * 10 + L'\xffffffd0';
            }
            pwVar7 = (wchar_t *)((uint *)pwVar7 + 1);
            wVar5 = id;
          } while (pwVar7 < local_78[7]);
        }
        else {
LAB_0048f633:
          id = L'\xffffffff';
        }
      }
      pwVar7 = local_78[2];
      wVar11 = local_84;
      local_90 = uVar13;
      if (0x1c < (long)local_78[1] - (long)local_78[0]) {
        local_80 = local_78[2];
        iVar4 = wmemcmp(local_78[0],anon_var_dwarf_f2f2d8,7);
        pwVar7 = local_80;
        wVar11 = local_84;
        if (iVar4 == 0) {
          pwVar8 = pwVar8 + 7;
          wVar11 = L'Ȁ';
          local_78[0] = pwVar8;
        }
      }
      wVar5 = L'\xffffffec';
      if (pwVar8 == pwVar2) {
        return L'\xffffffec';
      }
      wVar1 = *pwVar8;
      iVar4 = (int)local_90;
      switch((uint)(wVar1 + L'\xffffff99') >> 1 | (uint)((wVar1 + L'\xffffff99' & 1U) != 0) << 0x1f)
      {
      case 0:
switchD_0048f6bf_caseD_0:
        pwVar9 = pwVar8 + 1;
        piVar10 = anon_var_dwarf_f2f306;
        do {
          piVar10 = piVar10 + 1;
          if (pwVar2 <= pwVar9) break;
          wVar5 = *pwVar9;
          pwVar9 = pwVar9 + 1;
        } while (wVar5 == *piVar10);
        if (pwVar9 < pwVar2) {
          if (wVar1 != L'm') {
            if (wVar1 != L'o') {
              return L'\xffffffec';
            }
            goto switchD_0048f6bf_caseD_4;
          }
          goto switchD_0048f6bf_caseD_3;
        }
        local_90 = CONCAT44(local_90._4_4_,wVar11);
        wVar5 = ismode_w(local_78[4],local_78[5],&local_94);
        if (wVar5 == L'\0') {
          return L'\xffffffec';
        }
        if ((pwVar7 < pwVar12) || (id != L'\xffffffff')) {
          wVar5 = L'✓';
        }
        else {
          wVar5 = L'✔';
LAB_0048f8d9:
          pwVar12 = (wchar_t *)0x0;
          pwVar7 = (wchar_t *)0x0;
        }
LAB_0048f932:
        wVar11 = (wchar_t)local_90;
        goto LAB_0048f936;
      default:
        goto switchD_0048f6bf_caseD_1;
      case 4:
switchD_0048f6bf_caseD_4:
        pwVar9 = pwVar8 + 1;
        piVar10 = anon_var_dwarf_f2f31d;
        do {
          piVar10 = piVar10 + 1;
          if (pwVar2 <= pwVar9) break;
          wVar5 = *pwVar9;
          pwVar9 = pwVar9 + 1;
        } while (wVar5 == *piVar10);
        if (pwVar9 < pwVar2) {
          if (wVar1 != L'm') {
            return L'\xffffffec';
          }
          goto switchD_0048f6bf_caseD_3;
        }
        if (iVar4 == 2) {
          if (pwVar7 != pwVar12) {
            return L'\xffffffec';
          }
          pwVar12 = local_78[5];
          pwVar7 = local_78[4];
          if (local_78[5] <= local_78[4]) {
            return L'\xffffffec';
          }
        }
        else {
          if (iVar4 != 1) {
            return L'\xffffffec';
          }
          if (pwVar12 <= pwVar7) {
            return L'\xffffffec';
          }
        }
        wVar5 = ismode_w(pwVar7,pwVar12,&local_94);
        if (wVar5 == L'\0') {
          return L'\xffffffec';
        }
        wVar5 = L'✖';
        goto LAB_0048f91b;
      case 7:
        pwVar9 = pwVar8 + 1;
        piVar10 = anon_var_dwarf_f2f2ef;
        do {
          piVar10 = piVar10 + 1;
          if (pwVar2 <= pwVar9) break;
          wVar5 = *pwVar9;
          pwVar9 = pwVar9 + 1;
        } while (wVar5 == *piVar10);
        if (pwVar2 <= pwVar9) {
          local_90 = CONCAT44(local_90._4_4_,wVar11);
          wVar5 = ismode_w(local_78[4],local_78[5],&local_94);
          if (wVar5 == L'\0') {
            return L'\xffffffec';
          }
          if ((pwVar12 <= pwVar7) && (id == L'\xffffffff')) {
            wVar5 = L'✒';
            goto LAB_0048f8d9;
          }
          wVar5 = L'✑';
          goto LAB_0048f932;
        }
        if (wVar1 == L'o') goto switchD_0048f6bf_caseD_4;
        if (wVar1 != L'm') {
          if (wVar1 != L'g') {
            return L'\xffffffec';
          }
          goto switchD_0048f6bf_caseD_0;
        }
      case 3:
switchD_0048f6bf_caseD_3:
        pwVar8 = pwVar8 + 1;
        piVar10 = anon_var_dwarf_f2f328;
        do {
          piVar10 = piVar10 + 1;
          if (pwVar2 <= pwVar8) break;
          wVar5 = *pwVar8;
          pwVar8 = pwVar8 + 1;
        } while (wVar5 == *piVar10);
        if (pwVar8 < pwVar2) {
          return L'\xffffffec';
        }
        if (iVar4 == 2) {
          if (pwVar7 != pwVar12) {
            return L'\xffffffec';
          }
          pwVar12 = local_78[5];
          pwVar7 = local_78[4];
          if (local_78[5] <= local_78[4]) {
            return L'\xffffffec';
          }
        }
        else {
          if (iVar4 != 1) {
            return L'\xffffffec';
          }
          if (pwVar12 <= pwVar7) {
            return L'\xffffffec';
          }
        }
        wVar5 = ismode_w(pwVar7,pwVar12,&local_94);
        if (wVar5 == L'\0') {
          return L'\xffffffec';
        }
        wVar5 = L'✕';
LAB_0048f91b:
        pwVar12 = (wchar_t *)0x0;
        pwVar7 = (wchar_t *)0x0;
LAB_0048f936:
        archive_acl_add_entry_w_len
                  (local_38,wVar11,local_94,wVar5,id,pwVar7,(long)pwVar12 - (long)pwVar7 >> 2);
        uVar6 = 0;
        if (*text == L'\0') {
          return L'\0';
        }
      }
    } while( true );
  }
switchD_0048f6bf_caseD_1:
  return wVar5;
}

Assistant:

int
archive_acl_parse_w(struct archive_acl *acl,
    const wchar_t *text, int default_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[4], name;

	int fields, n;
	int type, tag, permset, id;
	wchar_t sep;

	while (text != NULL  &&  *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint_w(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint_w(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && wmemcmp(field[0].start, L"default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_w(field[0].start, field[0].end, L"user")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"group")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_w(field[0].start, field[0].end, L"mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
	}
	return (ARCHIVE_OK);
}